

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O2

bool __thiscall
Scine::Core::ModuleManager::Impl::has(Impl *this,string *interface,string *model,string *moduleName)

{
  pointer pLVar1;
  pointer psVar2;
  element_type *peVar3;
  bool bVar4;
  char cVar5;
  pointer pLVar6;
  to_lowerF<char> tVar7;
  LibraryAndModules *source;
  pointer psVar8;
  shared_ptr<Scine::Core::Module> *modulePtr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string modulePtrLower;
  string moduleNameLower;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  tVar7.m_Loc = (locale *)moduleName;
  std::locale::locale((locale *)(local_98 + 8));
  boost::algorithm::detail::
  transform_range_copy<std::__cxx11::string,std::__cxx11::string,boost::algorithm::detail::to_lowerF<char>>
            (&local_70,(detail *)moduleName,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 8),
             tVar7);
  std::locale::~locale((locale *)(local_98 + 8));
  if ((moduleName->_M_string_length == 0) || (bVar4 = std::operator!=(&local_70,"any"), !bVar4)) {
    pLVar1 = (this->_sources).
             super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pLVar6 = (this->_sources).
                  super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                  ._M_impl.super__Vector_impl_data._M_start; pLVar6 != pLVar1; pLVar6 = pLVar6 + 1)
    {
      psVar8 = (pLVar6->modules).
               super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar2 = (pLVar6->modules).
               super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      while (psVar8 != psVar2) {
        peVar3 = (psVar8->super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        cVar5 = (**(code **)(*(long *)peVar3 + 0x20))(peVar3,interface,model);
        psVar8 = psVar8 + 1;
        if (cVar5 != '\0') goto LAB_0010c935;
      }
    }
  }
  else {
    pLVar1 = (this->_sources).
             super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pLVar6 = (this->_sources).
                  super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                  ._M_impl.super__Vector_impl_data._M_start; pLVar6 != pLVar1; pLVar6 = pLVar6 + 1)
    {
      psVar2 = (pLVar6->modules).
               super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      tVar7.m_Loc = (locale *)pLVar1;
      for (psVar8 = (pLVar6->modules).
                    super__Vector_base<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          __return_storage_ptr__ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_98 + 8),
          psVar8 != psVar2; psVar8 = psVar8 + 1) {
        (**(code **)(*(long *)(psVar8->
                              super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr + 0x10))(&local_50);
        std::locale::locale((locale *)local_98);
        boost::algorithm::detail::
        transform_range_copy<std::__cxx11::string,std::__cxx11::string,boost::algorithm::detail::to_lowerF<char>>
                  (__return_storage_ptr__,(detail *)&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   tVar7);
        std::locale::~locale((locale *)local_98);
        std::__cxx11::string::~string((string *)&local_50);
        bVar4 = std::operator!=(__return_storage_ptr__,&local_70);
        if (bVar4) {
          std::operator+(&local_50,&local_70,"module");
          bVar4 = std::operator!=(__return_storage_ptr__,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if (!bVar4) goto LAB_0010c8b8;
        }
        else {
LAB_0010c8b8:
          peVar3 = (psVar8->super___shared_ptr<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          cVar5 = (**(code **)(*(long *)peVar3 + 0x20))(peVar3,interface,model);
          if (cVar5 != '\0') {
            std::__cxx11::string::~string((string *)(local_98 + 8));
            goto LAB_0010c935;
          }
        }
        std::__cxx11::string::~string((string *)(local_98 + 8));
      }
    }
  }
  bVar4 = false;
LAB_0010c937:
  std::__cxx11::string::~string((string *)&local_70);
  return bVar4;
LAB_0010c935:
  bVar4 = true;
  goto LAB_0010c937;
}

Assistant:

bool has(const std::string& interface, const std::string& model, const std::string& moduleName) const {
    // If the module name is specified, look in detailed fashion
    std::string moduleNameLower = boost::algorithm::to_lower_copy(moduleName);
    if (!moduleName.empty() && moduleNameLower != "any") {
      for (const auto& source : _sources) {
        for (const auto& modulePtr : source.modules) {
          std::string modulePtrLower = boost::algorithm::to_lower_copy(modulePtr->name());
          if ((modulePtrLower != moduleNameLower) && (modulePtrLower != moduleNameLower + "module")) {
            continue;
          }

          if (modulePtr->has(interface, model)) {
            return true;
          }
        }
      }
      return false;
    }

    for (const auto& source : _sources) {
      for (const auto& modulePtr : source.modules) {
        if (modulePtr->has(interface, model)) {
          return true;
        }
      }
    }

    return false;
  }